

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

void png_destroy_gamma_table(png_structrp png_ptr)

{
  uint uVar1;
  ulong uVar2;
  
  png_free(png_ptr,png_ptr->gamma_table);
  png_ptr->gamma_table = (png_bytep)0x0;
  if (png_ptr->gamma_16_table != (png_uint_16pp)0x0) {
    if (png_ptr->gamma_shift != -0x17) {
      uVar1 = 1 << (8U - (char)png_ptr->gamma_shift & 0x1f);
      if ((int)uVar1 < 2) {
        uVar1 = 1;
      }
      uVar2 = 0;
      do {
        png_free(png_ptr,png_ptr->gamma_16_table[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    png_free(png_ptr,png_ptr->gamma_16_table);
    png_ptr->gamma_16_table = (png_uint_16pp)0x0;
  }
  png_free(png_ptr,png_ptr->gamma_from_1);
  png_ptr->gamma_from_1 = (png_bytep)0x0;
  png_free(png_ptr,png_ptr->gamma_to_1);
  png_ptr->gamma_to_1 = (png_bytep)0x0;
  if (png_ptr->gamma_16_from_1 != (png_uint_16pp)0x0) {
    if (png_ptr->gamma_shift != -0x17) {
      uVar1 = 1 << (8U - (char)png_ptr->gamma_shift & 0x1f);
      if ((int)uVar1 < 2) {
        uVar1 = 1;
      }
      uVar2 = 0;
      do {
        png_free(png_ptr,png_ptr->gamma_16_from_1[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    png_free(png_ptr,png_ptr->gamma_16_from_1);
    png_ptr->gamma_16_from_1 = (png_uint_16pp)0x0;
  }
  if (png_ptr->gamma_16_to_1 != (png_uint_16pp)0x0) {
    if (png_ptr->gamma_shift != -0x17) {
      uVar1 = 1 << (8U - (char)png_ptr->gamma_shift & 0x1f);
      if ((int)uVar1 < 2) {
        uVar1 = 1;
      }
      uVar2 = 0;
      do {
        png_free(png_ptr,png_ptr->gamma_16_to_1[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    png_free(png_ptr,png_ptr->gamma_16_to_1);
    png_ptr->gamma_16_to_1 = (png_uint_16pp)0x0;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_destroy_gamma_table(png_structrp png_ptr)
{
   png_free(png_ptr, png_ptr->gamma_table);
   png_ptr->gamma_table = NULL;

#ifdef PNG_16BIT_SUPPORTED
   if (png_ptr->gamma_16_table != NULL)
   {
      int i;
      int istop = (1 << (8 - png_ptr->gamma_shift));
      for (i = 0; i < istop; i++)
      {
         png_free(png_ptr, png_ptr->gamma_16_table[i]);
      }
   png_free(png_ptr, png_ptr->gamma_16_table);
   png_ptr->gamma_16_table = NULL;
   }
#endif /* 16BIT */

#if defined(PNG_READ_BACKGROUND_SUPPORTED) || \
   defined(PNG_READ_ALPHA_MODE_SUPPORTED) || \
   defined(PNG_READ_RGB_TO_GRAY_SUPPORTED)
   png_free(png_ptr, png_ptr->gamma_from_1);
   png_ptr->gamma_from_1 = NULL;
   png_free(png_ptr, png_ptr->gamma_to_1);
   png_ptr->gamma_to_1 = NULL;

#ifdef PNG_16BIT_SUPPORTED
   if (png_ptr->gamma_16_from_1 != NULL)
   {
      int i;
      int istop = (1 << (8 - png_ptr->gamma_shift));
      for (i = 0; i < istop; i++)
      {
         png_free(png_ptr, png_ptr->gamma_16_from_1[i]);
      }
   png_free(png_ptr, png_ptr->gamma_16_from_1);
   png_ptr->gamma_16_from_1 = NULL;
   }
   if (png_ptr->gamma_16_to_1 != NULL)
   {
      int i;
      int istop = (1 << (8 - png_ptr->gamma_shift));
      for (i = 0; i < istop; i++)
      {
         png_free(png_ptr, png_ptr->gamma_16_to_1[i]);
      }
   png_free(png_ptr, png_ptr->gamma_16_to_1);
   png_ptr->gamma_16_to_1 = NULL;
   }
#endif /* 16BIT */
#endif /* READ_BACKGROUND || READ_ALPHA_MODE || RGB_TO_GRAY */
}